

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  char cVar6;
  char *pcVar7;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  _Alloc_hider _Var12;
  uint uVar13;
  _Alloc_hider _Var14;
  ulong uVar15;
  int iVar16;
  size_type sVar17;
  uint uVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  ulong size;
  string groups;
  char digits [40];
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar6 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar6 != '\0') {
      uVar13 = this->abs_value;
      uVar11 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar11 * 2);
      uVar22 = (uint)uVar3 -
               (uint)(uVar13 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)uVar3 * 4));
      iVar20 = -(uint)(uVar13 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         (ulong)uVar3 * 4));
      pcVar7 = local_298._M_dataplus._M_p + local_298._M_string_length;
      _Var12._M_p = local_298._M_dataplus._M_p;
      uVar11 = uVar22;
      uVar9 = uVar22;
      if (local_298._M_string_length != 0) {
        _Var14._M_p = local_298._M_dataplus._M_p;
        sVar17 = local_298._M_string_length;
        uVar10 = uVar22;
        do {
          cVar2 = *_Var14._M_p;
          uVar18 = uVar9 - (int)cVar2;
          _Var12._M_p = _Var14._M_p;
          uVar11 = uVar10;
          if ((uVar18 == 0 || (int)uVar9 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar10 = uVar10 + 1;
          _Var14._M_p = _Var14._M_p + 1;
          sVar17 = sVar17 - 1;
          _Var12._M_p = pcVar7;
          uVar11 = (int)local_298._M_string_length + iVar20 + (uint)uVar3;
          uVar9 = uVar18;
        } while (sVar17 != 0);
      }
      if (_Var12._M_p == pcVar7) {
        uVar11 = uVar11 + (int)(uVar9 - 1) / (int)pcVar7[-1];
      }
      pcVar7 = local_278 + (int)uVar22;
      uVar9 = uVar13;
      if (99 < uVar13) {
        do {
          uVar13 = uVar9 / 100;
          *(undefined2 *)(pcVar7 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar9 % 100) * 2);
          pcVar7 = pcVar7 + -2;
          bVar5 = 9999 < uVar9;
          uVar9 = uVar9 / 100;
        } while (bVar5);
      }
      if (uVar13 < 10) {
        pcVar7[-1] = (byte)uVar13 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar7 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar13 * 2)
        ;
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00740d10;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar11 = uVar11 + this->prefix_size;
      if (-1 < (int)uVar11) {
        size = (ulong)uVar11;
        if (500 < uVar11) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
        }
        pcVar7 = local_248.super_buffer<char>.ptr_;
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (size <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = size;
        }
        pcVar19 = local_248.super_buffer<char>.ptr_ + (size - 1);
        if (1 < (int)uVar22) {
          uVar15 = (ulong)uVar22;
          iVar16 = iVar20 + (uint)uVar3 + 1;
          iVar20 = 0;
          _Var12._M_p = local_298._M_dataplus._M_p;
          do {
            uVar15 = uVar15 - 1;
            pcVar1 = pcVar19 + -1;
            *pcVar19 = local_278[uVar15 & 0xffffffff];
            cVar2 = *_Var12._M_p;
            if ('\0' < cVar2) {
              iVar20 = iVar20 + 1;
              if ((cVar2 != '\x7f') && (iVar20 % (int)cVar2 == 0)) {
                if (_Var12._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
                  iVar20 = 0;
                  _Var12._M_p = _Var12._M_p + 1;
                }
                pcVar19[-1] = cVar6;
                pcVar1 = pcVar19 + -2;
              }
            }
            pcVar19 = pcVar1;
            iVar16 = iVar16 + -1;
          } while (2 < iVar16);
        }
        *pcVar19 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar19[-1] = '-';
        }
        pbVar4 = this->specs;
        uVar15 = (ulong)pbVar4->width;
        if (-1 < (long)uVar15) {
          uVar21 = 0;
          if (size <= uVar15) {
            uVar21 = uVar15 - size;
          }
          uVar15 = uVar21 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                       (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
          bVar8 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            ((this->out).container,uVar15,&pbVar4->fill);
          bVar8 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                            (pcVar7,pcVar7 + size,bVar8);
          bVar8 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            (bVar8,uVar21 - uVar15,&pbVar4->fill);
          (this->out).container = bVar8.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_);
          }
          goto LAB_00399ae1;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_00399ae1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }